

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpreter.cpp
# Opt level: O3

void __thiscall Interpreter::execute(Interpreter *this,bool showExecutionTime)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *ident;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ostream *poVar6;
  undefined4 *puVar7;
  ptr<Function> main;
  string local_78;
  Member local_58;
  Callable local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  ident = (this->object).super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"main","");
  Object::getFunction((Object *)&local_58,(Identifier *)ident);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_58._vptr_Member != (_func_int **)0x0) {
    std::chrono::_V2::system_clock::now();
    local_78._M_dataplus._M_p = (pointer)0x0;
    local_78._M_string_length = 0;
    local_78.field_2._M_allocated_capacity = 0;
    (**(code **)(*local_58._vptr_Member + 0x48))(local_30);
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
    std::vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>::~vector
              ((vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_> *)&local_78
              );
    if (showExecutionTime) {
      std::chrono::_V2::system_clock::now();
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
      std::ostream::put(-0x70);
      poVar6 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Executed in ",0xc);
      poVar6 = std::ostream::_M_insert<long>((long)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ms",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._vptr_Callable !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._vptr_Callable);
    }
    return;
  }
  puVar7 = (undefined4 *)__cxa_allocate_exception(0x10);
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"No function named \'main\' is defined","");
  ExceptionObjects::undefined((ExceptionObjects *)&local_48,&local_78);
  uVar2 = (undefined4)local_48;
  uVar3 = local_48._4_4_;
  uVar4 = (undefined4)uStack_40;
  uVar5 = uStack_40._4_4_;
  local_48 = (__buckets_ptr)0x0;
  uStack_40 = 0;
  *puVar7 = uVar2;
  puVar7[1] = uVar3;
  puVar7[2] = uVar4;
  puVar7[3] = uVar5;
  __cxa_throw(puVar7,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
}

Assistant:

void Interpreter::execute(bool showExecutionTime) {
    ptr<Function> main = object -> getFunction("main");

    if(!main)
        throw ThrowPacket(ExceptionObjects::undefined("No function named 'main' is defined"));

    auto start = std::chrono::high_resolution_clock::now();

    try {
        ValueList initial = {};
        main -> call(initial);
    } catch(ReturnPacket& returnPacket) {}

    if(showExecutionTime) {
        auto stop = std::chrono::high_resolution_clock::now();
        auto duration = std::chrono::duration_cast<std::chrono::microseconds>(stop - start);
        std::cout << std::endl << "Executed in " << duration.count() << " ms" << std::endl;
    }
}